

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrROL0x36(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  byte value;
  
  addr = this->PC;
  this->PC = addr + 1;
  uVar1 = Memory::Read8(this->m,addr);
  bVar2 = uVar1 + this->X;
  this_00 = this->m;
  bVar3 = Memory::Read8(this_00,(ushort)bVar2);
  value = (byte)this->field_0x2e >> 7 | bVar3 * '\x02';
  this->field_0x2e =
       (byte)(bVar3 * '\x02') >> 7 | bVar3 & 0x80 | this->field_0x2e & 0x3e | (value == 0) << 6;
  Memory::Write8(this_00,(ushort)bVar2,value);
  return 6;
}

Assistant:

int CPU::instrROL0x36() {
	uint16_t address = zeropage_x_addr_j();
	m->Write8(address, ROL(m->Read8(address)));
	return 6;
}